

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly3_span_add(poly3_span *out,poly3_span *a,poly3_span *b,size_t n)

{
  ulong local_30;
  size_t i;
  size_t n_local;
  poly3_span *b_local;
  poly3_span *a_local;
  poly3_span *out_local;
  
  for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
    poly3_word_add(out->s + local_30,out->a + local_30,a->s[local_30],a->a[local_30],b->s[local_30],
                   b->a[local_30]);
  }
  return;
}

Assistant:

static void poly3_span_add(const struct poly3_span *out,
                           const struct poly3_span *a,
                           const struct poly3_span *b, size_t n) {
  for (size_t i = 0; i < n; i++) {
    poly3_word_add(&out->s[i], &out->a[i], a->s[i], a->a[i], b->s[i], b->a[i]);
  }
}